

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall wasm::DataFlow::Printer::warnOnSuspiciousValues(Printer *this,Node *node)

{
  Node *node_00;
  Function *pFVar1;
  bool bVar2;
  int iVar3;
  reference ppNVar4;
  Node *pNVar5;
  ostream *poVar6;
  ostream *poVar7;
  Name name;
  Name name_00;
  Node *value;
  iterator __end2;
  iterator __begin2;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *__range2;
  Node *node_local;
  Printer *this_local;
  
  iVar3 = debug();
  if (iVar3 == 0) {
    __assert_fail("debug()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x2a5,"void wasm::DataFlow::Printer::warnOnSuspiciousValues(Node *)");
  }
  __end2 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::begin
                     (&node->values);
  value = (Node *)std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::end
                            (&node->values);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                                *)&value);
    if (!bVar2) {
      bVar2 = allInputsIdentical(node);
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "^^ suspicious identical inputs! missing optimization in ");
        pFVar1 = this->graph->func;
        poVar7 = (ostream *)(pFVar1->super_Importable).super_Named.name.super_IString.str._M_len;
        name.super_IString.str._M_str = (char *)poVar7;
        name.super_IString.str._M_len =
             (size_t)(pFVar1->super_Importable).super_Named.name.super_IString.str._M_str;
        poVar7 = wasm::operator<<((wasm *)poVar6,poVar7,name);
        std::operator<<(poVar7,"? ^^\n");
      }
      else {
        bVar2 = Node::isPhi(node);
        if ((!bVar2) && (bVar2 = allInputsConstant(node), bVar2)) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "^^ suspicious constant inputs! missing optimization in ");
          pFVar1 = this->graph->func;
          poVar7 = (ostream *)(pFVar1->super_Importable).super_Named.name.super_IString.str._M_len;
          name_00.super_IString.str._M_str = (char *)poVar7;
          name_00.super_IString.str._M_len =
               (size_t)(pFVar1->super_Importable).super_Named.name.super_IString.str._M_str;
          poVar7 = wasm::operator<<((wasm *)poVar6,poVar7,name_00);
          std::operator<<(poVar7,"? ^^\n");
        }
      }
      return;
    }
    ppNVar4 = __gnu_cxx::
              __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
              ::operator*(&__end2);
    node_00 = *ppNVar4;
    pNVar5 = getMaybeReplaced(this,node_00);
    if (node_00 != pNVar5) break;
    __gnu_cxx::
    __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void warnOnSuspiciousValues(Node* node) {
    assert(debug());
    // If the node has no uses, it's not interesting enough to be
    // suspicious. TODO
    // If an input was replaced with a var, then we should not
    // look into it, it's not suspiciously trivial.
    for (auto* value : node->values) {
      if (value != getMaybeReplaced(value)) {
        return;
      }
    }
    if (allInputsIdentical(node)) {
      std::cout << "^^ suspicious identical inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
    if (!node->isPhi() && allInputsConstant(node)) {
      std::cout << "^^ suspicious constant inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
  }